

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalGetFileSize
                    (CPalThread *pThread,HANDLE hFile,DWORD *pdwFileSizeLow,DWORD *pdwFileSizeHigh)

{
  DWORD DVar1;
  int iVar2;
  undefined1 local_d0 [8];
  stat stat_data;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  
  pLocalDataLock = (IDataLock *)0x0;
  stat_data.__glibc_reserved[2] = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  if (hFile == (HANDLE)0xffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) {
LAB_002d6e8d:
      abort();
    }
    DVar1 = 6;
  }
  else {
    DVar1 = (**(code **)(*g_pObjectManager + 0x28))
                      (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalDataLock);
    if ((DVar1 == 0) &&
       (DVar1 = (*pLocalDataLock->_vptr_IDataLock[3])
                          (pLocalDataLock,pThread,0,&pLocalData,stat_data.__glibc_reserved + 2),
       DVar1 == 0)) {
      iVar2 = fstat64(*(int *)(stat_data.__glibc_reserved[2] + 8),(stat64 *)local_d0);
      if (iVar2 == 0) {
        *pdwFileSizeLow = (DWORD)stat_data.st_rdev;
        DVar1 = 0;
        if (pdwFileSizeHigh != (DWORD *)0x0) {
          *pdwFileSizeHigh = (DWORD)(stat_data.st_rdev >> 0x20);
        }
      }
      else {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002d6e8d;
        DVar1 = FILEGetLastErrorFromErrno();
      }
    }
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
  }
  return DVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetFileSize(
    CPalThread *pThread,
    HANDLE hFile,
    DWORD *pdwFileSizeLow,
    DWORD *pdwFileSizeHigh
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    struct stat stat_data;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalGetFileSizeExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileSizeExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileSizeExit;
    }

    if (fstat(pLocalData->unix_fd, &stat_data) != 0)
    {
        ERROR("fstat failed of file descriptor %d\n", pLocalData->unix_fd);
        palError = FILEGetLastErrorFromErrno();
        goto InternalGetFileSizeExit;
    }

    *pdwFileSizeLow = (DWORD)stat_data.st_size;
    
    if (NULL != pdwFileSizeHigh)
    {
#if SIZEOF_OFF_T > 4
        *pdwFileSizeHigh = (DWORD)(stat_data.st_size >> 32);
#else
        *pdwFileSizeHigh = 0;
#endif
    }

InternalGetFileSizeExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}